

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

wchar_t terminal_get_size(EditLine *el,wchar_t *lins,wchar_t *cols)

{
  int iVar1;
  bool local_29;
  ushort local_28;
  ushort local_26;
  winsize ws;
  wchar_t *cols_local;
  wchar_t *lins_local;
  EditLine *el_local;
  
  *cols = (el->el_terminal).t_val[3];
  *lins = (el->el_terminal).t_val[2];
  ws = (winsize)cols;
  iVar1 = ioctl(el->el_infd,0x5413,&local_28);
  if (iVar1 != -1) {
    if (local_26 != 0) {
      *(uint *)ws = (uint)local_26;
    }
    if (local_28 != 0) {
      *lins = (uint)local_28;
    }
  }
  local_29 = true;
  if ((el->el_terminal).t_val[3] == *(wchar_t *)ws) {
    local_29 = (el->el_terminal).t_val[2] != *lins;
  }
  return (wchar_t)local_29;
}

Assistant:

libedit_private int
terminal_get_size(EditLine *el, int *lins, int *cols)
{

	*cols = Val(T_co);
	*lins = Val(T_li);

#ifdef TIOCGWINSZ
	{
		struct winsize ws;
		if (ioctl(el->el_infd, TIOCGWINSZ, &ws) != -1) {
			if (ws.ws_col)
				*cols = ws.ws_col;
			if (ws.ws_row)
				*lins = ws.ws_row;
		}
	}
#endif
#ifdef TIOCGSIZE
	{
		struct ttysize ts;
		if (ioctl(el->el_infd, TIOCGSIZE, &ts) != -1) {
			if (ts.ts_cols)
				*cols = ts.ts_cols;
			if (ts.ts_lines)
				*lins = ts.ts_lines;
		}
	}
#endif
	return Val(T_co) != *cols || Val(T_li) != *lins;
}